

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O2

string * vk::BinaryRegistryDetail::anon_unknown_8::getIndexPath
                   (string *__return_storage_ptr__,string *dirName)

{
  allocator<char> local_69;
  FilePath local_68;
  FilePath local_48;
  FilePath local_28;
  
  std::__cxx11::string::string((string *)&local_48,(string *)dirName);
  de::FilePath::FilePath(&local_68,"index.bin");
  de::FilePath::join(&local_28,&local_48,&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_28.m_path._M_dataplus._M_p,&local_69);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

string getIndexPath (const std::string& dirName)
{
	return de::FilePath::join(dirName, "index.bin").getPath();
}